

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_rejects_table.cpp
# Opt level: O2

shared_ptr<duckdb::CSVRejectsTable,_true> __thiscall
duckdb::CSVRejectsTable::GetOrCreate
          (CSVRejectsTable *this,ClientContext *context,string *rejects_scan,string *rejects_error)

{
  CSVRejectsTable *pCVar1;
  __type _Var2;
  ObjectCache *key_00;
  Catalog *this_00;
  optional_ptr<duckdb::TableCatalogEntry,_true> oVar3;
  optional_ptr<duckdb::TableCatalogEntry,_true> oVar4;
  ostream *poVar5;
  BinderException *pBVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::CSVRejectsTable,_true> sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  CSVRejectsTable *local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  string local_1e8;
  string local_1c8;
  ostringstream error;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0 [46];
  
  _Var2 = ::std::operator==(rejects_scan,rejects_error);
  if (_Var2) {
    pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&error,
               "The names of the rejects scan and rejects error tables can\'t be the same. Use different names for these tables."
               ,(allocator *)&key);
    BinderException::BinderException(pBVar6,(string *)&error);
    __cxa_throw(pBVar6,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  StringUtil::Upper(&local_1c8,rejects_scan);
  ::std::operator+(&local_230,"CSV_REJECTS_TABLE_CACHE_ENTRY_",&local_1c8);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error,
                   &local_230,"_");
  StringUtil::Upper(&local_1e8,rejects_error);
  local_210 = this;
  ::std::operator+(&key,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error,
                   &local_1e8);
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::__cxx11::string::~string((string *)&error);
  ::std::__cxx11::string::~string((string *)&local_230);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  key_00 = ObjectCache::GetObjectCache(context);
  ::std::__cxx11::string::string((string *)&error,"temp",(allocator *)&local_230);
  this_00 = Catalog::GetCatalog(context,(string *)&error);
  ::std::__cxx11::string::~string((string *)&error);
  ::std::__cxx11::string::string((string *)&error,"main",(allocator *)&local_230);
  oVar3 = Catalog::GetEntry<duckdb::TableCatalogEntry>
                    (this_00,context,(string *)&error,rejects_scan,RETURN_NULL,
                     (QueryErrorContext)0xffffffffffffffff);
  ::std::__cxx11::string::~string((string *)&error);
  ::std::__cxx11::string::string((string *)&error,"main",(allocator *)&local_230);
  oVar4 = Catalog::GetEntry<duckdb::TableCatalogEntry>
                    (this_00,context,(string *)&error,rejects_error,RETURN_NULL,
                     (QueryErrorContext)0xffffffffffffffff);
  ::std::__cxx11::string::~string((string *)&error);
  if (oVar3.ptr != (TableCatalogEntry *)0x0 || oVar4.ptr != (TableCatalogEntry *)0x0) {
    ObjectCache::Get<duckdb::CSVRejectsTable>((ObjectCache *)&error,(string *)key_00);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1a0);
    if (_error == (pointer)0x0) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
      if (oVar3.ptr != (TableCatalogEntry *)0x0) {
        poVar5 = ::std::operator<<((ostream *)&error,"Reject Scan Table name \"");
        poVar5 = ::std::operator<<(poVar5,(string *)rejects_scan);
        ::std::operator<<(poVar5,"\" is already in use. ");
      }
      if (oVar4.ptr != (TableCatalogEntry *)0x0) {
        poVar5 = ::std::operator<<((ostream *)&error,"Reject Error Table name \"");
        poVar5 = ::std::operator<<(poVar5,(string *)rejects_error);
        ::std::operator<<(poVar5,"\" is already in use. ");
      }
      ::std::operator<<((ostream *)&error,
                        "Either drop the used name(s), or give other name options in the CSV Reader function.\n"
                       );
      pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::stringbuf::str();
      BinderException::BinderException(pBVar6,&local_230);
      __cxa_throw(pBVar6,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  pCVar1 = local_210;
  ObjectCache::
  GetOrCreate<duckdb::CSVRejectsTable,std::__cxx11::string_const&,std::__cxx11::string_const&>
            ((ObjectCache *)local_210,(string *)key_00,&key,rejects_scan);
  ::std::__cxx11::string::~string((string *)&key);
  sVar7.internal.super___shared_ptr<duckdb::CSVRejectsTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar7.internal.super___shared_ptr<duckdb::CSVRejectsTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pCVar1;
  return (shared_ptr<duckdb::CSVRejectsTable,_true>)
         sVar7.internal.super___shared_ptr<duckdb::CSVRejectsTable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<CSVRejectsTable> CSVRejectsTable::GetOrCreate(ClientContext &context, const string &rejects_scan,
                                                         const string &rejects_error) {
	// Check that these names can't be the same
	if (rejects_scan == rejects_error) {
		throw BinderException("The names of the rejects scan and rejects error tables can't be the same. Use different "
		                      "names for these tables.");
	}
	auto key =
	    "CSV_REJECTS_TABLE_CACHE_ENTRY_" + StringUtil::Upper(rejects_scan) + "_" + StringUtil::Upper(rejects_error);
	auto &cache = ObjectCache::GetObjectCache(context);
	auto &catalog = Catalog::GetCatalog(context, TEMP_CATALOG);
	auto rejects_scan_exist = catalog.GetEntry<TableCatalogEntry>(context, DEFAULT_SCHEMA, rejects_scan,
	                                                              OnEntryNotFound::RETURN_NULL) != nullptr;
	auto rejects_error_exist = catalog.GetEntry<TableCatalogEntry>(context, DEFAULT_SCHEMA, rejects_error,
	                                                               OnEntryNotFound::RETURN_NULL) != nullptr;
	if ((rejects_scan_exist || rejects_error_exist) && !cache.Get<CSVRejectsTable>(key)) {
		std::ostringstream error;
		if (rejects_scan_exist) {
			error << "Reject Scan Table name \"" << rejects_scan << "\" is already in use. ";
		}
		if (rejects_error_exist) {
			error << "Reject Error Table name \"" << rejects_error << "\" is already in use. ";
		}
		error << "Either drop the used name(s), or give other name options in the CSV Reader function.\n";
		throw BinderException(error.str());
	}

	return cache.GetOrCreate<CSVRejectsTable>(key, rejects_scan, rejects_error);
}